

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<PartialJointPolicyPureVector> __thiscall
boost::dynamic_pointer_cast<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure>
          (boost *this,shared_ptr<PartialJointPolicyDiscretePure> *r)

{
  sp_counted_base *psVar1;
  shared_count in_RDX;
  undefined1 auVar2 [16];
  shared_ptr<PartialJointPolicyPureVector> sVar3;
  
  if (r->px != (element_type *)0x0) {
    auVar2 = __dynamic_cast(r->px,&PartialJointPolicyDiscretePure::typeinfo,
                            &PartialJointPolicyPureVector::typeinfo,0);
    in_RDX.pi_ = auVar2._8_8_;
    if (auVar2._0_8_ != 0) {
      *(long *)this = auVar2._0_8_;
      psVar1 = (r->pn).pi_;
      *(sp_counted_base **)(this + 8) = psVar1;
      if (psVar1 != (sp_counted_base *)0x0) {
        LOCK();
        psVar1->use_count_ = psVar1->use_count_ + 1;
        UNLOCK();
      }
      goto LAB_0043b00a;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0043b00a:
  sVar3.pn.pi_ = in_RDX.pi_;
  sVar3.px = (element_type *)this;
  return sVar3;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}